

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

double __thiscall ON_Xform::Determinant(ON_Xform *this,double *pivot)

{
  double local_a8;
  double p;
  double d;
  double I [4] [4];
  double *pivot_local;
  ON_Xform *this_local;
  
  p = 0.0;
  local_a8 = 0.0;
  I[3][3] = (double)pivot;
  Inv((double *)this,(double (*) [4])&d,&p,&local_a8);
  if (I[3][3] != 0.0) {
    *(double *)I[3][3] = local_a8;
  }
  if ((p != 0.0) || (NAN(p))) {
    p = 1.0 / p;
  }
  return p;
}

Assistant:

double ON_Xform::Determinant( double* pivot ) const
{
  double I[4][4], d = 0.0, p = 0.0;
  //int rank = 
  Inv( &m_xform[0][0], I, &d, &p );
  if ( pivot )
    *pivot = p;
  if (d != 0.0 )
    d = 1.0/d;

  return d;
}